

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O0

int MPIABI_Waitall(int count,MPIABI_Request *array_of_requests,MPIABI_Status *array_of_statuses)

{
  anon_union_24_2_44bf1552_for_mpi_status *paVar1;
  WPI_Status local_b0;
  int local_88;
  int local_84;
  int i_1;
  int ierr;
  MPI_Status local_58;
  int local_3c;
  MPIABI_Status *pMStack_38;
  int i;
  MPI_Status *stats;
  MPI_Request *reqs;
  MPIABI_Status *pMStack_20;
  bool ignore_statuses;
  MPIABI_Status *array_of_statuses_local;
  MPIABI_Request *array_of_requests_local;
  int count_local;
  
  reqs._7_1_ = array_of_statuses == (MPIABI_Status *)0x0;
  pMStack_38 = array_of_statuses;
  stats = (MPI_Status *)array_of_requests;
  pMStack_20 = array_of_statuses;
  array_of_statuses_local = (MPIABI_Status *)array_of_requests;
  array_of_requests_local._4_4_ = count;
  if (!(bool)reqs._7_1_) {
    for (local_3c = 0; local_3c < array_of_requests_local._4_4_; local_3c = local_3c + 1) {
      WPI_Status::WPI_Status((WPI_Status *)&i_1,pMStack_20 + local_3c);
      WPI_Status::operator_cast_to_ompi_status_public_t(&local_58,(WPI_Status *)&i_1);
      paVar1 = &pMStack_38->mpi_status + local_3c;
      *(undefined8 *)paVar1 = local_58._0_8_;
      *(undefined8 *)((long)paVar1 + 8) = local_58._8_8_;
      *(size_t *)((long)paVar1 + 0x10) = local_58._ucount;
    }
  }
  local_84 = MPI_Waitall(array_of_requests_local._4_4_,stats,pMStack_38);
  local_88 = array_of_requests_local._4_4_;
  if ((reqs._7_1_ & 1) == 0) {
    while (local_88 = local_88 + -1, -1 < local_88) {
      WPI_Status::WPI_Status(&local_b0,(MPI_Status *)(&pMStack_38->mpi_status + local_88));
      memcpy(pMStack_20 + local_88,&local_b0,0x28);
    }
  }
  return local_84;
}

Assistant:

int MPIABI_Waitall(int count, MPIABI_Request array_of_requests[],
                              MPIABI_Status array_of_statuses[]) {
  const bool ignore_statuses =
      (MPI_Status *)array_of_statuses == MPI_STATUSES_IGNORE;
  MPI_Request *const reqs = (MPI_Request *)(void *)array_of_requests;
  if (sizeof(MPI_Request) != sizeof(MPIABI_Request))
    for (int i = 0; i < count; ++i)
      reqs[i] = (WPI_Request)array_of_requests[i];
  MPI_Status *const stats = (MPI_Status *)(void *)array_of_statuses;
  if (!ignore_statuses)
    for (int i = 0; i < count; ++i)
      stats[i] = (WPI_Status)array_of_statuses[i];
  const int ierr = MPI_Waitall(count, reqs, stats);
  if (sizeof(MPI_Request) != sizeof(MPIABI_Request))
    for (int i = count - 1; i >= 0; --i)
      array_of_requests[i] = (WPI_Request)reqs[i];
  if (!ignore_statuses)
    for (int i = count - 1; i >= 0; --i)
      array_of_statuses[i] = (WPI_Status)stats[i];
  return ierr;
}